

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O1

void __thiscall
dynamicgraph::SignalTimeDependent<double,_int>::~SignalTimeDependent
          (SignalTimeDependent<double,_int> *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_TimeDependency<int>)._vptr_TimeDependency =
       (_func_int **)&PTR__TimeDependency_00133848;
  p_Var2 = (this->super_TimeDependency<int>).dependencies.
           super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&(this->super_TimeDependency<int>).dependencies) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  Signal<double,_int>::~Signal((Signal<double,_int> *)&this->field_0x40);
  return;
}

Assistant:

virtual ~SignalTimeDependent() {}